

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O2

int ssh_versioncmp(char *a,char *b)

{
  char *__nptr;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  char *be;
  char *ae;
  
  uVar1 = strtoul(a,&ae,10);
  uVar2 = strtoul(b,&be,10);
  if (uVar1 == uVar2) {
    if (*ae == '.') {
      ae = ae + 1;
    }
    if (*be == '.') {
      be = be + 1;
    }
    __nptr = be;
    uVar1 = strtoul(ae,&ae,10);
    uVar2 = strtoul(__nptr,&be,10);
    if (uVar1 == uVar2) {
      return 0;
    }
    bVar3 = uVar1 < uVar2;
  }
  else {
    bVar3 = uVar1 < uVar2;
  }
  return -(uint)bVar3 | 1;
}

Assistant:

static int ssh_versioncmp(const char *a, const char *b)
{
    char *ae, *be;
    unsigned long av, bv;

    av = strtoul(a, &ae, 10);
    bv = strtoul(b, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    if (*ae == '.')
        ae++;
    if (*be == '.')
        be++;
    av = strtoul(ae, &ae, 10);
    bv = strtoul(be, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    return 0;
}